

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::EventsProcessorTests::ignoreLeftButtonUpOnFoundationPilesFromFirstTo
          (EventsProcessorTests *this,uint pilesToIgnore)

{
  uint *puVar1;
  MockSpec<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
  *this_00;
  TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
  *this_01;
  MockSpec<bool_(const_solitaire::geometry::Position_&)> *this_02;
  TypedExpectation<bool_(const_solitaire::geometry::Position_&)> *this_03;
  ReturnAction<bool> local_108;
  Action<bool_(const_solitaire::geometry::Position_&)> local_f8;
  WithoutMatchers local_d1;
  Matcher<const_solitaire::geometry::Position_&> local_d0;
  MockSpec<bool_(const_solitaire::geometry::Position_&)> local_b8;
  StrictMock<solitaire::colliders::FoundationPileColliderMock> *local_98;
  Action<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
  local_90;
  WithoutMatchers local_6d [17];
  PileId local_5c;
  Matcher<solitaire::piles::PileId> local_58;
  MockSpec<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
  local_40;
  uint local_1c;
  PileId local_18;
  uint local_14;
  PileId id;
  uint pilesToIgnore_local;
  EventsProcessorTests *this_local;
  
  local_1c = 0;
  local_14 = pilesToIgnore;
  _id = this;
  piles::PileId::PileId(&local_18,&local_1c);
  while( true ) {
    puVar1 = piles::PileId::operator_cast_to_unsigned_int_(&local_18);
    if (local_14 <= *puVar1) break;
    piles::PileId::PileId(&local_5c,&local_18);
    testing::Matcher<solitaire::piles::PileId>::Matcher(&local_58,&local_5c);
    ContextMock::gmock_getFoundationPileCollider
              (&local_40,&(this->contextMock).super_ContextMock,&local_58);
    testing::internal::GetWithoutMatchers();
    this_00 = testing::internal::
              MockSpec<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
              ::operator()(&local_40,local_6d,(void *)0x0);
    this_01 = testing::internal::
              MockSpec<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
              ::InternalExpectedAt
                        (this_00,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                         ,0x58,"contextMock","getFoundationPileCollider(id)");
    local_98 = (StrictMock<solitaire::colliders::FoundationPileColliderMock> *)
               testing::
               ReturnRef<testing::StrictMock<solitaire::colliders::FoundationPileColliderMock>>
                         (&this->foundationPileColliderMock);
    testing::internal::ReturnRefAction::operator_cast_to_Action
              (&local_90,(ReturnRefAction *)&local_98);
    testing::internal::
    TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
    ::WillOnce(this_01,&local_90);
    testing::
    Action<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>::
    ~Action(&local_90);
    testing::internal::
    MockSpec<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>::
    ~MockSpec(&local_40);
    testing::Matcher<solitaire::piles::PileId>::~Matcher(&local_58);
    testing::Matcher<solitaire::geometry::Position_const&>::
    Matcher<testing::internal::AnythingMatcher_const&,void>
              ((Matcher<solitaire::geometry::Position_const&> *)&local_d0,
               (AnythingMatcher *)&testing::_);
    colliders::FoundationPileColliderMock::gmock_collidesWithCardsInHand
              (&local_b8,&(this->foundationPileColliderMock).super_FoundationPileColliderMock,
               &local_d0);
    testing::internal::GetWithoutMatchers();
    this_02 = testing::internal::MockSpec<bool_(const_solitaire::geometry::Position_&)>::operator()
                        (&local_b8,&local_d1,(void *)0x0);
    this_03 = testing::internal::MockSpec<bool_(const_solitaire::geometry::Position_&)>::
              InternalExpectedAt(this_02,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                                 ,0x5a,"foundationPileColliderMock","collidesWithCardsInHand(_)");
    testing::Return<bool>((testing *)&local_108,false);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_f8,(ReturnAction *)&local_108);
    testing::internal::TypedExpectation<bool_(const_solitaire::geometry::Position_&)>::WillOnce
              (this_03,&local_f8);
    testing::Action<bool_(const_solitaire::geometry::Position_&)>::~Action(&local_f8);
    testing::internal::ReturnAction<bool>::~ReturnAction(&local_108);
    testing::internal::MockSpec<bool_(const_solitaire::geometry::Position_&)>::~MockSpec(&local_b8);
    testing::Matcher<const_solitaire::geometry::Position_&>::~Matcher(&local_d0);
    puVar1 = piles::PileId::operator_cast_to_unsigned_int_(&local_18);
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void ignoreLeftButtonUpOnFoundationPilesFromFirstTo(unsigned pilesToIgnore) {
        for (PileId id {0}; id < pilesToIgnore; ++id) {
            EXPECT_CALL(contextMock, getFoundationPileCollider(id))
                .WillOnce(ReturnRef(foundationPileColliderMock));
            EXPECT_CALL(foundationPileColliderMock, collidesWithCardsInHand(_))
                .WillOnce(Return(false));
        }
    }